

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  Mode MVar1;
  bool bVar2;
  
  MVar1 = this->m_mode;
  if (c == '\\' && MVar1 != EscapedName) {
    escape(this);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    push_back(&this->m_substring,'\\');
    c = '\\';
  }
  else {
    if (c == ',' && MVar1 != EscapedName) {
      bVar2 = separate(this);
      return bVar2;
    }
    if (MVar1 == EscapedName) {
      endMode(this);
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->m_substring,c);
    }
    else {
      if (MVar1 == Name) {
        processNameChar(this,c);
      }
      else if (MVar1 == None) {
        if (c < '[') {
          if (c == ' ') {
            return true;
          }
          if (c == '\"') {
            this->m_mode = QuotedName;
          }
          else {
LAB_00126cfe:
            this->m_mode = Name;
          }
        }
        else if (c == '[') {
          this->m_mode = Tag;
        }
        else {
          if (c != '~') goto LAB_00126cfe;
          this->m_exclusion = true;
        }
      }
      else {
        bVar2 = processOtherChar(this,c);
        if (bVar2) {
          return true;
        }
      }
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->m_substring,c);
      switch(this->m_mode) {
      case None:
        if (c == '~') {
          return true;
        }
        break;
      case Name:
        if (c == '[') {
          return true;
        }
        break;
      case QuotedName:
        if (c == '\"') {
          return true;
        }
        break;
      case Tag:
        if (c == '[') {
          return true;
        }
        if (c == ']') {
          return true;
        }
        break;
      case EscapedName:
        goto switchD_00126d2d_caseD_4;
      }
    }
  }
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&this->m_patternName,c);
  this->m_realPatternPos = this->m_realPatternPos + 1;
switchD_00126d2d_caseD_4:
  return true;
}

Assistant:

bool TestSpecParser::visitChar( char c ) {
        if( (m_mode != EscapedName) && (c == '\\') ) {
            escape();
            addCharToPattern(c);
            return true;
        }else if((m_mode != EscapedName) && (c == ',') )  {
            return separate();
        }

        switch( m_mode ) {
        case None:
            if( processNoneChar( c ) )
                return true;
            break;
        case Name:
            processNameChar( c );
            break;
        case EscapedName:
            endMode();
            addCharToPattern(c);
            return true;
        default:
        case Tag:
        case QuotedName:
            if( processOtherChar( c ) )
                return true;
            break;
        }

        m_substring += c;
        if( !isControlChar( c ) ) {
            m_patternName += c;
            m_realPatternPos++;
        }
        return true;
    }